

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpdtrans.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::CompoundTransliterator::joinIDs
          (UnicodeString *__return_storage_ptr__,CompoundTransliterator *this,
          Transliterator **transliterators,int32_t transCount)

{
  short sVar1;
  int iVar2;
  undefined4 extraout_var;
  int32_t srcLength;
  ulong uVar3;
  UChar local_2a;
  UnicodeString *src;
  
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_0048be70;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  if (0 < transCount) {
    uVar3 = 0;
    do {
      if (uVar3 != 0) {
        local_2a = L';';
        icu_63::UnicodeString::doAppend(__return_storage_ptr__,&local_2a,0,1);
      }
      iVar2 = (*(transliterators[uVar3]->super_UObject)._vptr_UObject[0xd])();
      src = (UnicodeString *)CONCAT44(extraout_var,iVar2);
      sVar1 = (src->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        srcLength = (src->fUnion).fFields.fLength;
      }
      else {
        srcLength = (int)sVar1 >> 5;
      }
      icu_63::UnicodeString::doAppend(__return_storage_ptr__,src,0,srcLength);
      uVar3 = uVar3 + 1;
    } while ((uint)transCount != uVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString CompoundTransliterator::joinIDs(Transliterator* const transliterators[],
                                              int32_t transCount) {
    UnicodeString id;
    for (int32_t i=0; i<transCount; ++i) {
        if (i > 0) {
            id.append(ID_DELIM);
        }
        id.append(transliterators[i]->getID());
    }
    return id; // Return temporary
}